

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string shader_source;
  int local_f0;
  int value_index;
  int variable_index;
  int number_of_elements;
  string *local_e0;
  string local_d8 [8];
  string variable_basenames [4];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string shader_body;
  TestShaderType tested_shader_type_local;
  ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  shader_body.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "    float a[2] = float[](1.0, 2.0);\n    float b[2][2] = float[][](float[](1.0, 2.0), float[](1.0, 2.0));\n    float c[2][2][2] = float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)),float[][](float[](1.0, 2.0), float[](1.0, 2.0)));\n    float d[2][2][2][2] = float[][][][](float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)), float[][](float[](1.0, 2.0), float[](1.0, 2.0))),float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)), float[][](float[](1.0, 2.0), float[](1.0, 2.0))));\n\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_e0 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"a",(allocator<char> *)((long)&number_of_elements + 3));
  local_e0 = (string *)(variable_basenames[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[0].field_2._M_local_buf + 8),"b",
             (allocator<char> *)((long)&number_of_elements + 2));
  local_e0 = (string *)(variable_basenames[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[1].field_2._M_local_buf + 8),"c",
             (allocator<char> *)((long)&number_of_elements + 1));
  local_e0 = (string *)(variable_basenames[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[2].field_2._M_local_buf + 8),"d",
             (allocator<char> *)&number_of_elements);
  std::allocator<char>::~allocator((allocator<char> *)&number_of_elements);
  std::allocator<char>::~allocator((allocator<char> *)((long)&number_of_elements + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&number_of_elements + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&number_of_elements + 3));
  for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
    for (shader_source.field_2._12_4_ = local_f0; (int)shader_source.field_2._12_4_ < 4;
        shader_source.field_2._12_4_ = shader_source.field_2._12_4_ + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     shader_start_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      if (local_f0 != shader_source.field_2._12_4_) {
        std::operator+(&local_178,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&variable_basenames[(long)local_f0 + -1].field_2 + 8));
        std::operator+(&local_158,&local_178," = ");
        std::operator+(&local_138,&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&variable_basenames[(long)(int)shader_source.field_2._12_4_ + -1].
                               field_2 + 8));
        std::__cxx11::string::operator+=((string *)local_118,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::operator+=((string *)local_118,";\n");
        switch(shader_body.field_2._12_4_) {
        case 0:
          break;
        case 1:
          std::__cxx11::string::operator+=((string *)local_118,"\n\tgl_Position = vec4(0.0);\n");
          break;
        case 2:
          break;
        case 3:
          std::__cxx11::string::operator+=((string *)local_118,(string *)emit_quad_abi_cxx11_);
          break;
        case 4:
          std::__cxx11::string::operator+=((string *)local_118,(string *)set_tesseation_abi_cxx11_);
          break;
        case 5:
          break;
        default:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0xaef);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        std::__cxx11::string::operator+=((string *)local_118,(string *)shader_end_abi_cxx11_);
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[8])(this,(ulong)(uint)shader_body.field_2._12_4_,local_118);
      }
      std::__cxx11::string::~string((string *)local_118);
    }
  }
  local_1f0 = (string *)(variable_basenames[3].field_2._M_local_buf + 8);
  do {
    local_1f0 = local_1f0 + -0x20;
    std::__cxx11::string::~string(local_1f0);
  } while (local_1f0 != local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ExpressionsAssignment2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_body("    float a[2] = float[](1.0, 2.0);\n"
							"    float b[2][2] = float[][](float[](1.0, 2.0), float[](1.0, 2.0));\n"
							"    float c[2][2][2] = float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)),"
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)));\n"
							"    float d[2][2][2][2] = float[][][][]("
							"float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)), "
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0))),"
							"float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)), "
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0))));\n\n");

	std::string variable_basenames[] = { "a", "b", "c", "d" };
	int			number_of_elements   = sizeof(variable_basenames) / sizeof(variable_basenames[0]);

	for (int variable_index = 0; variable_index < number_of_elements; variable_index++)
	{
		for (int value_index = variable_index; value_index < number_of_elements; value_index++)
		{
			std::string shader_source = shader_start + shader_body;

			/* Avoid the situation when a variable is assign to itself. */
			if (variable_index != value_index)
			{
				shader_source += "    " + variable_basenames[variable_index] + " = " + variable_basenames[value_index];
				shader_source += ";\n";

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* if(variable_index != value_index) */
		}	 /* for (int value_index = variable_index; ...) */
	}		  /* for (int variable_index = 0; ...) */
}